

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  pointer ppVar5;
  SetKey *set;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  TypeParam ht1;
  TypeParam ht2;
  SetKey local_1e9;
  TransparentHasher local_1e8;
  undefined1 local_1d8 [8];
  undefined8 *local_1d0;
  AssertHelper local_1c8;
  undefined1 local_1c0 [80];
  undefined **local_170;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_168;
  undefined **local_d0;
  int *local_c8 [5];
  bool local_9e;
  int local_8c;
  int local_88;
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_78;
  
  local_1c0._0_8_ =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c19c88;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_168,0,(TransparentHasher *)local_1c0,(TransparentHasher *)local_1d8,
                     (Identity *)&local_1e8,(SetKey *)&local_1c8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c19c08;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1e8.super_Hasher.id_ = 0;
  local_1e8.super_Hasher.num_hashes_ = 0;
  local_1e8.super_Hasher.num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  set = &local_1e9;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(TransparentHasher *)local_1d8,&local_1e8,(Identity *)&local_1c8,
                     set,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c19c08;
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_168);
  local_168.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_168.key_info.delkey.first = pVar4.first;
  local_168.key_info.delkey.second = pVar4.second;
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(2);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  local_9e = true;
  local_8c = pVar4.first;
  local_88 = pVar4.second;
  local_1d8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(10);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_1c0,
           (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)&local_168,(value_type *)local_1d8);
  local_1d8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(0x14);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_1c0,
           (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)local_c8,(value_type *)local_1d8);
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_168,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_c8);
  local_1d0 = (undefined8 *)0x0;
  local_1d8[0] = (internal)!bVar3;
  if (bVar3) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)local_1d8,(AssertionResult *)"ht1 == ht2","true",
               "false",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x197,(char *)local_1c0._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._0_8_ !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if ((pair<int,_int>)local_1e8.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1e8.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&local_168,
              (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8);
  local_1d8[0] = (internal)
                 google::
                 sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::operator==(&local_168,
                              (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)local_c8);
  local_1d0 = (undefined8 *)0x0;
  if (!(bool)local_1d8[0]) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)local_1d8,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x199,(char *)local_1c0._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._0_8_ !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if ((pair<int,_int>)local_1e8.super_Hasher._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1e8.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_1d0;
    if (local_1d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1d0 != local_1d0 + 2) {
        operator_delete((undefined8 *)*local_1d0);
      }
      operator_delete(puVar1);
    }
  }
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_78);
  local_170 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_168.table.groups);
  local_1c0._0_8_ =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c19c88;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_168,0,(TransparentHasher *)local_1c0,(TransparentHasher *)local_1d8,
                     (Identity *)&local_1e8,(SetKey *)&local_1c8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c19c08;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1e8.super_Hasher.id_ = 0;
  local_1e8.super_Hasher.num_hashes_ = 0;
  local_1e8.super_Hasher.num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(TransparentHasher *)local_1d8,&local_1e8,(Identity *)&local_1c8,
                     &local_1e9,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c19c08;
  local_1d8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(0x1e);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_1c0,
           (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)&local_168,(value_type *)local_1d8);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&local_168,
              (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8);
  local_1e8.super_Hasher._0_8_ = local_1e8.super_Hasher._0_8_ & 0xffffffff00000000;
  local_1d8 = (undefined1  [8])(local_168.table.settings.num_buckets - local_168.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","ht1.size()",(uint *)&local_1e8,(unsigned_long *)local_1d8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar5 = (pointer)0xaf1463;
    }
    else {
      ppVar5 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x19f,(char *)ppVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((value_type)local_1d8 != (value_type)0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_1c0._8_8_ !=
        (pointer)&(((Settings *)(local_1c0._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
    {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_78);
  local_170 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_168.table.groups);
  local_1c0._0_8_ =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_d0 = (undefined **)((ulong)local_d0 & 0xffffffff00000000);
  local_c8[0] = (int *)0x0;
  local_170 = &PTR__BaseHashtableInterface_00c19c88;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_168,0,(TransparentHasher *)local_1c0,(TransparentHasher *)local_1d8,
                     (Identity *)&local_1e8,(SetKey *)&local_1c8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d0);
  local_170 = &PTR__BaseHashtableInterface_00c19c08;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d0 = (undefined8 *)((ulong)local_1d0 & 0xffffffff00000000);
  local_1e8.super_Hasher.id_ = 0;
  local_1e8.super_Hasher.num_hashes_ = 0;
  local_1e8.super_Hasher.num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(TransparentHasher *)local_1d8,&local_1e8,(Identity *)&local_1c8,
                     &local_1e9,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_d0 = &PTR__BaseHashtableInterface_00c19c08;
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_168);
  local_168.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_168.key_info.delkey.first = pVar4.first;
  local_168.key_info.delkey.second = pVar4.second;
  local_1d8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_1c0,
           (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)local_c8,(value_type *)local_1d8);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&local_168,
              (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_c8);
  local_1e8.super_Hasher.id_ = 1;
  local_1d8 = (undefined1  [8])(local_168.table.settings.num_buckets - local_168.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","ht1.size()",(uint *)&local_1e8,(unsigned_long *)local_1d8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar5 = (pointer)0xaf1463;
    }
    else {
      ppVar5 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a6,(char *)ppVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((value_type)local_1d8 != (value_type)0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_1c0._8_8_ !=
        (pointer)&(((Settings *)(local_1c0._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
    {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_1c8.data_._0_4_ = 1;
  local_1e8.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(1);
  pVar6 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)&local_168,(pair<int,_int> *)&local_1e8);
  local_1d8._1_7_ = 0;
  local_1d8[0] = (internal)(pVar6.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","ht1.count(this->UniqueKey(1))",(uint *)&local_1c8,
             (unsigned_long *)local_1d8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar5 = (pointer)0xaf1463;
    }
    else {
      ppVar5 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a7,(char *)ppVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((value_type)local_1d8 != (value_type)0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_1c0._8_8_ !=
        (pointer)&(((Settings *)(local_1c0._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
    {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_78);
  local_170 = &PTR__BaseHashtableInterface_00c19c88;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_168.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}